

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileBlockManager::Initialize
          (SingleFileBlockManager *this,DatabaseHeader *header,optional_idx block_alloc_size)

{
  optional_idx *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  idx_t iVar5;
  InvalidInputException *pIVar6;
  StorageManager *pSVar7;
  optional_idx local_d0;
  string local_c8;
  ulong local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  optional_idx local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->free_list_id = header->free_list;
  this->meta_block = header->meta_block;
  this->iteration_count = header->iteration;
  local_d0.index = block_alloc_size.index;
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(header->block_count);
  this->max_block = lVar4;
  this_00 = &(this->options).storage_version;
  if ((this->options).storage_version.index == 0xffffffffffffffff) {
    optional_idx::optional_idx((optional_idx *)&local_c8,header->serialization_compatibility);
    this_00->index = (idx_t)local_c8._M_dataplus._M_p;
  }
  else {
    iVar5 = optional_idx::GetIndex(this_00);
    if (iVar5 < header->serialization_compatibility) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "Error opening \"%s\": cannot initialize database with storage version %d - which is lower than what the database itself uses (%d). The storage version of an existing database cannot be lowered."
                 ,"");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar2 = (this->path)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + (this->path)._M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
                (pIVar6,&local_c8,&local_98,iVar5,header->serialization_compatibility);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar3 = header->serialization_compatibility;
  SerializationCompatibility::Latest();
  paVar1 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (uVar3 <= local_a8) {
    pSVar7 = AttachedDatabase::GetStorageManager(this->db);
    iVar5 = optional_idx::GetIndex(this_00);
    optional_idx::optional_idx((optional_idx *)&local_c8,iVar5);
    (pSVar7->storage_version).index = (idx_t)local_c8._M_dataplus._M_p;
    if (local_d0.index != 0xffffffffffffffff) {
      iVar5 = optional_idx::GetIndex(&local_d0);
      if (iVar5 != header->block_alloc_size) {
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,
                   "Error opening \"%s\": cannot initialize the same database with a different block size: provided block size: %llu, file block size: %llu"
                   ,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar2 = (this->path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + (this->path)._M_string_length);
        iVar5 = optional_idx::GetIndex(&(this->super_BlockManager).block_alloc_size);
        InvalidInputException::
        InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
                  (pIVar6,&local_c8,&local_70,iVar5,header->block_alloc_size);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    optional_idx::optional_idx(&local_78,header->block_alloc_size);
    BlockManager::SetBlockAllocSize(&this->super_BlockManager,local_78);
    return;
  }
  pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,
             "Error opening \"%s\": file was written with a storage version greater than the latest version supported by this DuckDB instance. Try opening the file with a newer version of DuckDB."
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (this->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->path)._M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar6,&local_c8,&local_50);
  __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::Initialize(const DatabaseHeader &header, const optional_idx block_alloc_size) {
	free_list_id = header.free_list;
	meta_block = header.meta_block;
	iteration_count = header.iteration;
	max_block = NumericCast<block_id_t>(header.block_count);
	if (options.storage_version.IsValid()) {
		// storage version specified explicity - use requested storage version
		auto requested_compat_version = options.storage_version.GetIndex();
		if (requested_compat_version < header.serialization_compatibility) {
			throw InvalidInputException(
			    "Error opening \"%s\": cannot initialize database with storage version %d - which is lower than what "
			    "the database itself uses (%d). The storage version of an existing database cannot be lowered.",
			    path, requested_compat_version, header.serialization_compatibility);
		}
	} else {
		// load storage version from header
		options.storage_version = header.serialization_compatibility;
	}
	if (header.serialization_compatibility > SerializationCompatibility::Latest().serialization_version) {
		throw InvalidInputException(
		    "Error opening \"%s\": file was written with a storage version greater than the latest version supported "
		    "by this DuckDB instance. Try opening the file with a newer version of DuckDB.",
		    path);
	}

	db.GetStorageManager().SetStorageVersion(options.storage_version.GetIndex());

	if (block_alloc_size.IsValid() && block_alloc_size.GetIndex() != header.block_alloc_size) {
		throw InvalidInputException(
		    "Error opening \"%s\": cannot initialize the same database with a different block size: provided block "
		    "size: %llu, file block size: %llu",
		    path, GetBlockAllocSize(), header.block_alloc_size);
	}

	SetBlockAllocSize(header.block_alloc_size);
}